

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::UdpEntrySyntax::setChild(UdpEntrySyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00afe8c0 + *(int *)(&DAT_00afe8c0 + in_RSI * 4)))();
  return;
}

Assistant:

void UdpEntrySyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: inputs = child.node()->as<SyntaxList<UdpFieldBaseSyntax>>(); return;
        case 1: colon1 = child.token(); return;
        case 2: current = child.node() ? &child.node()->as<UdpFieldBaseSyntax>() : nullptr; return;
        case 3: colon2 = child.token(); return;
        case 4: next = child.node() ? &child.node()->as<UdpFieldBaseSyntax>() : nullptr; return;
        case 5: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}